

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_sendfile(http_s *r,int fd,uintptr_t length,uintptr_t offset)

{
  FIOBJ FVar1;
  int iVar2;
  FIOBJ FVar3;
  FIOBJ FVar4;
  
  if ((r != (http_s *)0x0) && (((r->method != 0 || (r->status_str != 0)) || (r->status == 0)))) {
    if (add_content_length_cl_hash == 0) {
      add_content_length_cl_hash = fio_siphash13("content-length",0xe,0x1456f2,0x145bc9);
    }
    FVar3 = fiobj_hash_get2((r->private_data).out_headers,add_content_length_cl_hash);
    FVar1 = HTTP_HEADER_CONTENT_LENGTH;
    if (FVar3 == 0) {
      FVar3 = (r->private_data).out_headers;
      if ((long)(length + 0x4000000000000000) < 0) {
        FVar4 = fiobj_num_new_bignum(length);
      }
      else {
        FVar4 = (length * 2 | length & 0x8000000000000000) + 1;
      }
      fiobj_hash_set(FVar3,FVar1,FVar4);
    }
    if (add_content_type_ct_hash == 0) {
      add_content_type_ct_hash = fio_siphash13("content-type",0xc,0x1456f2,0x145bc9);
    }
    FVar3 = fiobj_hash_get2((r->private_data).out_headers,add_content_type_ct_hash);
    FVar1 = HTTP_HEADER_CONTENT_TYPE;
    if (FVar3 == 0) {
      FVar3 = (r->private_data).out_headers;
      FVar4 = http_mimetype_find2(r->path);
      fiobj_hash_set(FVar3,FVar1,FVar4);
    }
    add_date(r);
    iVar2 = (**(code **)((long)(r->private_data).vtbl + 8))(r,fd,length,offset);
    return iVar2;
  }
  close(fd);
  return -1;
}

Assistant:

int http_sendfile(http_s *r, int fd, uintptr_t length, uintptr_t offset) {
  if (HTTP_INVALID_HANDLE(r)) {
    close(fd);
    return -1;
  };
  add_content_length(r, length);
  add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_sendfile(r, fd, length, offset);
}